

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O3

void png_do_bgr(png_row_infop row_info,png_bytep row)

{
  byte bVar1;
  png_byte pVar2;
  undefined2 uVar3;
  png_uint_32 pVar4;
  long lVar5;
  
  bVar1 = row_info->color_type;
  if ((bVar1 & 2) != 0) {
    pVar4 = row_info->width;
    if (row_info->bit_depth == '\x10') {
      if (bVar1 == 2) {
        for (; pVar4 != 0; pVar4 = pVar4 - 1) {
          uVar3 = *(undefined2 *)row;
          *(undefined2 *)row = *(undefined2 *)(row + 4);
          *(undefined2 *)(row + 4) = uVar3;
          row = row + 6;
        }
      }
      else if ((bVar1 == 6) && (pVar4 != 0)) {
        lVar5 = 0;
        do {
          uVar3 = *(undefined2 *)(row + lVar5 * 8);
          *(undefined2 *)(row + lVar5 * 8) = *(undefined2 *)(row + lVar5 * 8 + 4);
          *(undefined2 *)(row + lVar5 * 8 + 4) = uVar3;
          lVar5 = lVar5 + 1;
        } while (pVar4 != (png_uint_32)lVar5);
      }
    }
    else if (row_info->bit_depth == '\b') {
      if (bVar1 == 2) {
        for (; pVar4 != 0; pVar4 = pVar4 - 1) {
          pVar2 = *row;
          *row = row[2];
          row[2] = pVar2;
          row = row + 3;
        }
      }
      else if ((bVar1 == 6) && (pVar4 != 0)) {
        lVar5 = 0;
        do {
          pVar2 = row[lVar5 * 4];
          row[lVar5 * 4] = row[lVar5 * 4 + 2];
          row[lVar5 * 4 + 2] = pVar2;
          lVar5 = lVar5 + 1;
        } while (pVar4 != (png_uint_32)lVar5);
      }
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_bgr(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_bgr");

   if ((row_info->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_uint_32 row_width = row_info->width;
      if (row_info->bit_depth == 8)
      {
         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 3)
            {
               png_byte save = *rp;
               *rp = *(rp + 2);
               *(rp + 2) = save;
            }
         }

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 4)
            {
               png_byte save = *rp;
               *rp = *(rp + 2);
               *(rp + 2) = save;
            }
         }
      }

#ifdef PNG_16BIT_SUPPORTED
      else if (row_info->bit_depth == 16)
      {
         if (row_info->color_type == PNG_COLOR_TYPE_RGB)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 6)
            {
               png_byte save = *rp;
               *rp = *(rp + 4);
               *(rp + 4) = save;
               save = *(rp + 1);
               *(rp + 1) = *(rp + 5);
               *(rp + 5) = save;
            }
         }

         else if (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA)
         {
            png_bytep rp;
            png_uint_32 i;

            for (i = 0, rp = row; i < row_width; i++, rp += 8)
            {
               png_byte save = *rp;
               *rp = *(rp + 4);
               *(rp + 4) = save;
               save = *(rp + 1);
               *(rp + 1) = *(rp + 5);
               *(rp + 5) = save;
            }
         }
      }
#endif
   }
}